

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-util.cc
# Opt level: O2

void wabt::interp::WriteTrap(Stream *stream,char *desc,Ptr *trap)

{
  undefined8 local_38 [4];
  
  std::__cxx11::string::string((string *)local_38,(string *)&trap->obj_->message_);
  Stream::Writef(stream,"%s: %s\n",desc,local_38[0]);
  std::__cxx11::string::_M_dispose();
  return;
}

Assistant:

void WriteTrap(Stream* stream, const char* desc, const Trap::Ptr& trap) {
  stream->Writef("%s: %s\n", desc, trap->message().c_str());
}